

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O2

int agent_transact_unix(LIBSSH2_AGENT *agent,agent_transaction_ctx_t transctx)

{
  uint32_t uVar1;
  int iVar2;
  uchar *buffer;
  ssize_t sVar3;
  char *errmsg;
  LIBSSH2_SESSION *session;
  void **in_R9;
  uchar buf [4];
  
  iVar2 = 0;
  switch(transctx->state) {
  case agent_NB_state_request_created:
    _libssh2_htonu32(buf,(uint32_t)transctx->request_len);
    sVar3 = _send_all(agent->session->send,agent->fd,buf,4,(int)agent->session,in_R9);
    if ((int)sVar3 == -0xb) {
      return -0x25;
    }
    if (-1 < (int)sVar3) {
      transctx->state = agent_NB_state_request_length_sent;
      goto switchD_001083ef_caseD_2;
    }
    break;
  case agent_NB_state_request_length_sent:
switchD_001083ef_caseD_2:
    sVar3 = _send_all(agent->session->send,agent->fd,transctx->request,transctx->request_len,
                      (int)agent->session,in_R9);
    if ((int)sVar3 == -0xb) {
      return -0x25;
    }
    if (-1 < (int)sVar3) {
      transctx->state = agent_NB_state_request_sent;
      goto switchD_001083ef_caseD_3;
    }
    break;
  case agent_NB_state_request_sent:
switchD_001083ef_caseD_3:
    sVar3 = _recv_all(agent->session->recv,agent->fd,buf,4,(int)agent->session,in_R9);
    if (-1 < (int)sVar3) {
      uVar1 = _libssh2_ntohu32(buf);
      transctx->response_len = (ulong)uVar1;
      buffer = (uchar *)(*agent->session->alloc)((ulong)uVar1,&agent->session->abstract);
      transctx->response = buffer;
      if (buffer == (uchar *)0x0) {
        return -6;
      }
      transctx->state = agent_NB_state_response_length_received;
      goto LAB_001084ad;
    }
    if ((int)sVar3 == -0xb) {
      return -0x25;
    }
    session = agent->session;
    errmsg = "agent recv failed";
    iVar2 = -0x2b;
    goto LAB_00108501;
  case agent_NB_state_response_length_received:
    buffer = transctx->response;
LAB_001084ad:
    sVar3 = _recv_all(agent->session->recv,agent->fd,buffer,transctx->response_len,
                      (int)agent->session,in_R9);
    if (-1 < (int)sVar3) {
      transctx->state = agent_NB_state_response_received;
      return 0;
    }
    if ((int)sVar3 == -0xb) {
      return -0x25;
    }
    session = agent->session;
    errmsg = "agent recv failed";
    goto LAB_001084ff;
  default:
    goto switchD_001083ef_default;
  }
  session = agent->session;
  errmsg = "agent send failed";
LAB_001084ff:
  iVar2 = -7;
LAB_00108501:
  iVar2 = _libssh2_error(session,iVar2,errmsg);
switchD_001083ef_default:
  return iVar2;
}

Assistant:

static int
agent_transact_unix(LIBSSH2_AGENT *agent, agent_transaction_ctx_t transctx)
{
    unsigned char buf[4];
    int rc;

    /* Send the length of the request */
    if(transctx->state == agent_NB_state_request_created) {
        _libssh2_htonu32(buf, (uint32_t)transctx->request_len);
        rc = (int)_send_all(agent->session->send, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_length_sent;
    }

    /* Send the request body */
    if(transctx->state == agent_NB_state_request_length_sent) {
        rc = (int)_send_all(agent->session->send, agent->fd,
                            transctx->request, transctx->request_len, 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_sent;
    }

    /* Receive the length of a response */
    if(transctx->state == agent_NB_state_request_sent) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_RECV,
                                  "agent recv failed");
        }
        transctx->response_len = _libssh2_ntohu32(buf);
        transctx->response = LIBSSH2_ALLOC(agent->session,
                                           transctx->response_len);
        if(!transctx->response)
            return LIBSSH2_ERROR_ALLOC;

        transctx->state = agent_NB_state_response_length_received;
    }

    /* Receive the response body */
    if(transctx->state == agent_NB_state_response_length_received) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            transctx->response, transctx->response_len, 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent recv failed");
        }
        transctx->state = agent_NB_state_response_received;
    }

    return 0;
}